

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O2

void ewmh_add_window_state(natwm_state *state,xcb_window_t window,xcb_atom_t atom)

{
  undefined4 in_EAX;
  xcb_atom_t atom_local;
  
  xcb_change_property(state->xcb,0,window,state->ewmh->_NET_WM_STATE,4,0x20,1,
                      &stack0xffffffffffffffdc,0x107a7a,CONCAT44(atom,in_EAX));
  return;
}

Assistant:

void ewmh_add_window_state(const struct natwm_state *state, xcb_window_t window, xcb_atom_t atom)
{
        xcb_change_property(state->xcb,
                            XCB_PROP_MODE_REPLACE,
                            window,
                            state->ewmh->_NET_WM_STATE,
                            XCB_ATOM_ATOM,
                            32,
                            1,
                            &atom);
}